

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O3

boolean find_defensive(monst *mtmp,musable *m)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  level *lev;
  monst *pmVar5;
  monst *pmVar6;
  boolean bVar7;
  byte bVar8;
  xchar xVar9;
  int iVar10;
  trap *ptVar11;
  obj *poVar12;
  monuse mVar13;
  monuse mVar14;
  short sVar15;
  int iVar16;
  permonst *ppVar17;
  uint x0;
  uint uVar18;
  int y0;
  uint uVar19;
  bool bVar20;
  
  pmVar6 = u.ustuck;
  if ((mtmp->data->mflags1 & 0x50000) != 0) {
    return '\0';
  }
  cVar1 = mtmp->mx;
  x0 = (uint)cVar1;
  cVar2 = mtmp->my;
  y0 = (int)cVar2;
  lev = mtmp->dlevel;
  cVar3 = mtmp->data->mmove;
  iVar10 = dist2(x0,y0,(int)mtmp->mux,(int)mtmp->muy);
  if (0x19 < iVar10) {
    return '\0';
  }
  if ((u._1052_1_ & pmVar6 == mtmp) != 0) {
    return '\0';
  }
  m->defensive = (obj *)0x0;
  m->has_defense = MUSE_NONE;
  uVar19 = *(uint *)&mtmp->field_0x60;
  if ((uVar19 & 0x320000) == 0x20000) {
LAB_001f774a:
    iVar10 = mtmp->mhp;
    if (mtmp->mhpmax <= iVar10) {
      return '\0';
    }
    iVar16 = 5;
    if (9 < u.ulevel) {
      iVar16 = (u.ulevel < 0xe) + 3;
    }
    if ((9 < iVar10) && (mtmp->mhpmax <= iVar16 * iVar10)) {
      return '\0';
    }
    if ((mtmp->field_0x62 & 0x40) == 0) {
      cVar4 = lev->locations[(int)x0][y0].typ;
      if ((pmVar6 == mtmp || cVar3 == '\0') || cVar4 != '\x1a') {
        if ((pmVar6 == mtmp || cVar3 == '\0') || cVar4 != '\x1b') {
          cVar4 = (lev->sstairs).sx;
          if ((cVar4 != cVar1 || cVar4 == '\0') ||
             (mVar13 = MUSE_SSTAIRS, (lev->sstairs).sy != cVar2)) {
            if (pmVar6 != mtmp && cVar3 != '\0') {
              uVar19 = x0 - 1;
              do {
                iVar10 = -1;
                do {
                  if (((((0xffffffb0 < uVar19 - 0x50) && (uVar18 = y0 + iVar10, uVar18 < 0x15)) &&
                       ((uVar19 != (int)u.ux &&
                        ((uVar18 != (int)u.uy &&
                         ((iVar10 == 0 || uVar19 == x0) || mtmp->data != mons + 0x78)))))) &&
                      ((uVar19 == x0 && iVar10 == 0 ||
                       (lev->monsters[uVar19][uVar18] == (monst *)0x0)))) &&
                     ((ptVar11 = t_at(lev,uVar19,uVar18), ptVar11 != (trap *)0x0 &&
                      (((((ppVar17 = mtmp->data, ppVar17->msize == '\0' ||
                          ((ppVar17->mflags2 & 0x8000000) != 0)) || ((ppVar17->mflags1 & 8) != 0))
                        || (poVar12 = sobj_at(0x214,lev,uVar19,uVar18), poVar12 == (obj *)0x0)) &&
                       (bVar7 = onscary(uVar19,uVar18,mtmp), bVar7 == '\0')))))) {
                    bVar8 = ptVar11->field_0x8;
                    if ((((byte)((bVar8 & 0x1f) - 0xd) < 2) && (mtmp->data->mlet != '\x05')) &&
                       ((mtmp->field_0x63 & 0x1a) == 0)) {
                      bVar7 = can_fall_thru(lev);
                      mVar13 = MUSE_TRAPDOOR;
                      if (bVar7 == '\0') {
                        bVar8 = ptVar11->field_0x8;
                        goto LAB_001f7ab3;
                      }
                    }
                    else {
LAB_001f7ab3:
                      if (((bVar8 & 0x1f) != 0x10) ||
                         (mVar13 = MUSE_TELEPORT_TRAP, m->has_defense == MUSE_TRAPDOOR))
                      goto LAB_001f7ade;
                    }
                    trapx = uVar19;
                    trapy = uVar18;
                    m->has_defense = mVar13;
                  }
LAB_001f7ade:
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 2);
                bVar20 = uVar19 != x0 + 1;
                uVar19 = uVar19 + 1;
              } while (bVar20);
            }
            goto LAB_001f7c3d;
          }
        }
        else {
          if ((cVar1 == (lev->upladder).sx) && (cVar2 == (lev->upladder).sy)) {
            m->has_defense = MUSE_UP_LADDER;
          }
          if (((cVar1 != (lev->dnladder).sx) || (cVar2 != (lev->dnladder).sy)) ||
             (mVar13 = MUSE_DN_LADDER, mtmp->data->mlet == '\x05')) goto LAB_001f7c3d;
        }
      }
      else {
        if (((cVar1 == (lev->dnstair).sx) && (cVar2 == (lev->dnstair).sy)) &&
           (mtmp->data->mlet != '\x05')) {
          m->has_defense = MUSE_DOWNSTAIRS;
        }
        if ((cVar1 != (lev->upstair).sx) || (cVar2 != (lev->upstair).sy)) goto LAB_001f7c3d;
        xVar9 = ledger_no(&u.uz);
        mVar13 = MUSE_UPSTAIRS;
        if (xVar9 == '\x01') goto LAB_001f7c3d;
      }
      m->has_defense = mVar13;
LAB_001f7c3d:
      if ((mtmp->data->mflags1 & 0x2000) == 0) {
        if (((mtmp->data->mflags2 & 0x400) != 0) &&
           (poVar12 = m_carrying(mtmp,0x105), poVar12 != (obj *)0x0)) {
          uVar19 = x0 - 3;
          do {
            iVar10 = -3;
            do {
              if (((((uint)(y0 + iVar10) < 0x15 && uVar19 - 1 < 0x4f) &&
                   (pmVar5 = lev->monsters[uVar19][(uint)(y0 + iVar10)], pmVar5 != (monst *)0x0)) &&
                  ((*(uint *)&pmVar5->field_0x60 >> 9 & 1) == 0)) &&
                 ((((pmVar5->data->mflags2 & 0x400) != 0 && (pmVar5->data != (permonst *)0x30b000))
                  && ((*(uint *)&pmVar5->field_0x60 & 0xc0000) != 0x40000)))) {
                m->defensive = poVar12;
                m->has_defense = MUSE_BUGLE;
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != 4);
            bVar20 = uVar19 != x0 + 3;
            uVar19 = uVar19 + 1;
          } while (bVar20);
        }
        if (m->has_defense == MUSE_NONE) {
          ptVar11 = t_at(lev,x0,y0);
          if (ptVar11 == (trap *)0x0) {
            uVar19 = 0;
          }
          else {
            uVar19 = 0xfff7e7df >> (ptVar11->field_0x8 & 0x1f);
          }
          poVar12 = mtmp->minvent;
          if (poVar12 != (obj *)0x0) {
            mVar13 = m->has_defense;
            do {
              if ((mVar13 != MUSE_NONE) &&
                 ((uVar18 = mt_random(), uVar18 * -0x55555555 < 0x55555556 ||
                  (m->has_defense == MUSE_WAN_DIGGING)))) break;
              if (((poVar12->otyp == 0x1cf) &&
                  ((((pmVar6 != mtmp && (uVar19 & 1) == 0) && '\0' < poVar12->spe &&
                    ((mtmp->field_0x63 & 0x1a) == 0)) && (mtmp->data->mlet != '\x05')))) &&
                 (((u.uz.dnum != dungeon_topology.d_sokoban_dnum &&
                   ((lev->locations[(int)x0][y0].field_0x6 & 0x80) == 0)) &&
                  ((((bVar7 = Is_botlevel(&u.uz), bVar7 == '\0' &&
                     ((u.uz.dnum != dungeon_topology.d_astral_level.dnum &&
                      (bVar7 = is_ice(lev,x0,y0), bVar7 == '\0')))) &&
                    (bVar7 = is_pool(lev,x0,y0), bVar7 == '\0')) &&
                   ((bVar7 = is_lava(lev,x0,y0), bVar7 == '\0' &&
                    ((mtmp->data != mons + 0xea || (bVar7 = In_V_tower(&u.uz), bVar7 == '\0'))))))))
                 )) {
                m->defensive = poVar12;
                m->has_defense = MUSE_WAN_DIGGING;
                mVar14 = MUSE_WAN_DIGGING;
LAB_001f7f04:
                sVar15 = poVar12->otyp;
                if (((sVar15 == 0x1cb) && ('\0' < poVar12->spe)) &&
                   ((((lev->flags).field_0x9 & 8) == 0 || ((mtmp->mtrapseen & 0x8000) == 0)))) {
                  m->defensive = poVar12;
                  iVar10 = mon_has_amulet(mtmp);
                  mVar13 = MUSE_WAN_TELEPORTATION;
                  if (iVar10 == 0) {
                    mVar13 = MUSE_WAN_TELEPORTATION_SELF;
                  }
                  m->has_defense = mVar13;
                  sVar15 = poVar12->otyp;
                }
                else {
                  mVar13 = MUSE_SCR_TELEPORTATION;
                  if (mVar14 == MUSE_SCR_TELEPORTATION) goto LAB_001f8168;
                }
                if ((sVar15 == 0x15c) &&
                   (uVar18 = *(uint *)&mtmp->field_0x60, (uVar18 >> 0x11 & 1) != 0)) {
                  ppVar17 = mtmp->data;
                  if ((ppVar17->mflags1 & 0x1000) == 0) {
                    if ((poVar12->field_0x4a & 1) != 0) {
                      if ((uVar18 >> 0x19 & 1) != 0) {
                        iVar10 = inhishop(mtmp);
                        if (iVar10 != 0) goto LAB_001f7f7a;
                        uVar18 = *(uint *)&mtmp->field_0x60;
                      }
                      if ((uVar18 & 0x18000000) != 0) goto LAB_001f7f7a;
                    }
                    if ((((lev->flags).field_0x9 & 8) == 0) || ((mtmp->mtrapseen & 0x8000) == 0)) {
                      m->defensive = poVar12;
                      m->has_defense = MUSE_SCR_TELEPORTATION;
                    }
                    goto LAB_001f7f7a;
                  }
                }
                else {
LAB_001f7f7a:
                  ppVar17 = mtmp->data;
                }
                mVar14 = m->has_defense;
                mVar13 = MUSE_POT_FULL_HEALING;
                if (ppVar17 == mons + 0x145) {
                  if (mVar14 != MUSE_POT_FULL_HEALING) {
                    sVar15 = poVar12->otyp;
                    if (sVar15 == 0x13f) {
                      m->defensive = poVar12;
                      m->has_defense = MUSE_POT_FULL_HEALING;
                    }
                    else {
                      mVar13 = MUSE_WAN_CREATE_MONSTER;
                      if (mVar14 != MUSE_WAN_CREATE_MONSTER) {
                        if (sVar15 == 0x1c1) {
                          if ('\0' < poVar12->spe) {
                            m->defensive = poVar12;
                            m->has_defense = MUSE_WAN_CREATE_MONSTER;
                            goto LAB_001f8168;
                          }
                          sVar15 = 0x1c1;
                        }
                        goto LAB_001f813e;
                      }
                    }
                  }
                }
                else if (mVar14 != MUSE_POT_FULL_HEALING) {
                  sVar15 = poVar12->otyp;
                  if (sVar15 == 300) {
LAB_001f7fa7:
                    m->defensive = poVar12;
                    m->has_defense = mVar13;
                    mVar14 = mVar13;
LAB_001f7fb3:
                    if (ppVar17->mlet == '0') {
                      if (sVar15 == 0x151) {
LAB_001f80d5:
                        m->defensive = poVar12;
                        m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
                        goto LAB_001f80e3;
                      }
                    }
                    else if ((sVar15 == 0x151) && ((ppVar17->mflags2 & 0x100) != 0))
                    goto LAB_001f80d5;
LAB_001f813e:
                    mVar13 = MUSE_SCR_CREATE_MONSTER;
                    if ((mVar14 != MUSE_SCR_CREATE_MONSTER) && (mVar13 = mVar14, sVar15 == 0x158)) {
                      m->defensive = poVar12;
                      m->has_defense = MUSE_SCR_CREATE_MONSTER;
                      mVar13 = MUSE_SCR_CREATE_MONSTER;
                    }
                  }
                  else {
                    mVar13 = MUSE_POT_EXTRA_HEALING;
                    if (mVar14 != MUSE_POT_EXTRA_HEALING) {
                      if (sVar15 == 0x136) goto LAB_001f7fa7;
                      mVar13 = MUSE_WAN_CREATE_MONSTER;
                      if (mVar14 == MUSE_WAN_CREATE_MONSTER) goto LAB_001f8168;
                      if (sVar15 != 0x1c1) {
                        mVar13 = MUSE_POT_HEALING;
                        if (mVar14 == MUSE_POT_HEALING) goto LAB_001f8168;
                        if (sVar15 == 0x131) goto LAB_001f7fa7;
                        if (mVar14 == MUSE_POT_VAMPIRE_BLOOD) goto LAB_001f80e3;
                        goto LAB_001f7fb3;
                      }
                      if ('\0' < poVar12->spe) goto LAB_001f7fa7;
                      mVar13 = mVar14;
                      if (mVar14 == MUSE_POT_HEALING) goto LAB_001f8168;
                      if (mVar14 != MUSE_POT_VAMPIRE_BLOOD) goto LAB_001f7fb3;
LAB_001f80e3:
                      mVar13 = MUSE_POT_VAMPIRE_BLOOD;
                    }
                  }
                }
              }
              else {
                mVar14 = m->has_defense;
                mVar13 = mVar14;
                if ((mVar14 != MUSE_WAN_TELEPORTATION_SELF) && (mVar14 != MUSE_WAN_TELEPORTATION))
                goto LAB_001f7f04;
              }
LAB_001f8168:
              poVar12 = poVar12->nobj;
            } while (poVar12 != (obj *)0x0);
          }
        }
      }
      return m->has_defense != MUSE_NONE;
    }
    if ((mtmp->data->mflags1 & 0x2000) != 0) {
      return '\0';
    }
    poVar12 = m_carrying(mtmp,300);
    if (poVar12 != (obj *)0x0) {
LAB_001f7b6c:
      m->defensive = poVar12;
      m->has_defense = MUSE_POT_FULL_HEALING;
      return '\x01';
    }
    poVar12 = m_carrying(mtmp,0x136);
    if (poVar12 != (obj *)0x0) {
LAB_001f7d46:
      m->defensive = poVar12;
      m->has_defense = MUSE_POT_EXTRA_HEALING;
      return '\x01';
    }
    poVar12 = m_carrying(mtmp,0x131);
    if (poVar12 == (obj *)0x0) {
      if ((mtmp->data->mlet != '0') && ((mtmp->data->mflags2 & 0x100) == 0)) {
        return '\0';
      }
      poVar12 = m_carrying(mtmp,0x151);
      if (poVar12 != (obj *)0x0) {
        m->defensive = poVar12;
        m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
        return '\x01';
      }
      return '\0';
    }
LAB_001f7d93:
    m->defensive = poVar12;
    m->has_defense = MUSE_POT_HEALING;
  }
  else {
    ppVar17 = mtmp->data;
    if ((ppVar17->mlet != '\x15') || ((ppVar17->mflags2 & 0x20000000) == 0)) {
      if ((ppVar17->mflags1 & 0x2000) == 0) {
        for (poVar12 = mtmp->minvent; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
          if ((poVar12->otyp == 0x10a) && ((poVar12->field_0x4a & 1) == 0)) goto LAB_001f7869;
        }
      }
      if ((ppVar17->mlet != '\x15') || ((ppVar17->mflags2 & 0x20000000) == 0)) {
        if ((uVar19 >> 0x15 & 1) != 0) {
          for (poVar12 = mtmp->minvent; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
            if ((poVar12->otyp == 0x10e) && (poVar12->corpsenm == 0x154)) {
              m->defensive = poVar12;
              m->has_defense = MUSE_LIZARD_CORPSE;
              return '\x01';
            }
          }
        }
        if (((uVar19 >> 0x11 & 1) != 0) ||
           (ppVar17 == mons + 0x145 || (ppVar17->mflags1 & 0x2000) != 0)) goto LAB_001f774a;
        poVar12 = m_carrying(mtmp,300);
        if (poVar12 != (obj *)0x0) goto LAB_001f7b6c;
        poVar12 = m_carrying(mtmp,0x136);
        if (poVar12 != (obj *)0x0) goto LAB_001f7d46;
        poVar12 = m_carrying(mtmp,0x131);
        if (poVar12 == (obj *)0x0) goto LAB_001f774a;
        goto LAB_001f7d93;
      }
    }
    poVar12 = (obj *)0x0;
LAB_001f7869:
    m->defensive = poVar12;
    m->has_defense = MUSE_UNICORN_HORN;
  }
  return '\x01';
}

Assistant:

boolean find_defensive(struct monst *mtmp, struct musable *m)
{
	struct obj *obj = 0;
	struct trap *t;
	int x=mtmp->mx, y=mtmp->my;
	struct level *lev = mtmp->dlevel;
	boolean stuck = (mtmp == u.ustuck);
	boolean immobile = (mtmp->data->mmove == 0);
	int fraction;

	if (is_animal(mtmp->data) || mindless(mtmp->data))
		return FALSE;
	if (dist2(x, y, mtmp->mux, mtmp->muy) > 25)
		return FALSE;
	if (u.uswallow && stuck) return FALSE;

	m->defensive = NULL;
	m->has_defense = 0;

	/* since unicorn horns don't get used up, the monster would look
	 * silly trying to use the same cursed horn round after round
	 */
	if (mtmp->mconf || mtmp->mstun || !mtmp->mcansee) {
	    if (!is_unicorn(mtmp->data) && !nohands(mtmp->data)) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->otyp == UNICORN_HORN && !obj->cursed)
			break;
	    }
	    if (obj || is_unicorn(mtmp->data)) {
		m->defensive = obj;
		m->has_defense = MUSE_UNICORN_HORN;
		return TRUE;
	    }
	}

	if (mtmp->mconf) {
	    for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		if (obj->otyp == CORPSE && obj->corpsenm == PM_LIZARD) {
		    m->defensive = obj;
		    m->has_defense = MUSE_LIZARD_CORPSE;
		    return TRUE;
		}
	    }
	}

	/* It so happens there are two unrelated cases when we might want to
	 * check specifically for healing alone.  The first is when the monster
	 * is blind (healing cures blindness).  The second is when the monster
	 * is peaceful; then we don't want to flee the player, and by
	 * coincidence healing is all there is that doesn't involve fleeing.
	 * These would be hard to combine because of the control flow.
	 * Pestilence won't use healing even when blind.
	 */
	if (!mtmp->mcansee && !nohands(mtmp->data) &&
		mtmp->data != &mons[PM_PESTILENCE]) {
	    if ((obj = m_carrying(mtmp, POT_FULL_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_FULL_HEALING;
		return TRUE;
	    }
	    if ((obj = m_carrying(mtmp, POT_EXTRA_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_EXTRA_HEALING;
		return TRUE;
	    }
	    if ((obj = m_carrying(mtmp, POT_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_HEALING;
		return TRUE;
	    }
	}

	fraction = u.ulevel < 10 ? 5 : u.ulevel < 14 ? 4 : 3;
	if (mtmp->mhp >= mtmp->mhpmax ||
			(mtmp->mhp >= 10 && mtmp->mhp*fraction >= mtmp->mhpmax))
		return FALSE;

	if (mtmp->mpeaceful) {
	    if (!nohands(mtmp->data)) {
		if ((obj = m_carrying(mtmp, POT_FULL_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_FULL_HEALING;
		    return TRUE;
		}
		if ((obj = m_carrying(mtmp, POT_EXTRA_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_EXTRA_HEALING;
		    return TRUE;
		}
		if ((obj = m_carrying(mtmp, POT_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_HEALING;
		    return TRUE;
		}
		if (is_vampire(mtmp->data) &&
		    (obj = m_carrying(mtmp, POT_VAMPIRE_BLOOD)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
		    return TRUE;
		}
	    }
	    return FALSE;
	}

	if (lev->locations[x][y].typ == STAIRS && !stuck && !immobile) {
		if (x == lev->dnstair.sx && y == lev->dnstair.sy && !is_floater(mtmp->data))
			m->has_defense = MUSE_DOWNSTAIRS;
		if (x == lev->upstair.sx && y == lev->upstair.sy && ledger_no(&u.uz) != 1)
	/* Unfair to let the monsters leave the dungeon with the Amulet */
	/* (or go to the endlevel since you also need it, to get there) */
			m->has_defense = MUSE_UPSTAIRS;
	} else if (lev->locations[x][y].typ == LADDER && !stuck && !immobile) {
		if (x == lev->upladder.sx && y == lev->upladder.sy)
			m->has_defense = MUSE_UP_LADDER;
		if (x == lev->dnladder.sx && y == lev->dnladder.sy && !is_floater(mtmp->data))
			m->has_defense = MUSE_DN_LADDER;
	} else if (lev->sstairs.sx && lev->sstairs.sx == x && lev->sstairs.sy == y) {
		m->has_defense = MUSE_SSTAIRS;
	} else if (!stuck && !immobile) {
	/* Note: trap doors take precedence over teleport traps. */
		int xx, yy;

		for (xx = x-1; xx <= x+1; xx++) for(yy = y-1; yy <= y+1; yy++)
		if (isok(xx,yy))
		if (xx != u.ux && yy != u.uy)
		if (mtmp->data != &mons[PM_GRID_BUG] || xx == x || yy == y)
		if ((xx==x && yy==y) || !lev->monsters[xx][yy])
		if ((t = t_at(lev, xx,yy)) != 0)
		if ((verysmall(mtmp->data) || throws_rocks(mtmp->data) ||
		     passes_walls(mtmp->data)) || !sobj_at(BOULDER, lev, xx, yy))
		if (!onscary(xx,yy,mtmp)) {
			if ((t->ttyp == TRAPDOOR || t->ttyp == HOLE)
				&& !is_floater(mtmp->data)
				&& !mtmp->isshk && !mtmp->isgd
				&& !mtmp->ispriest
				&& can_fall_thru(lev)) {
				trapx = xx;
				trapy = yy;
				m->has_defense = MUSE_TRAPDOOR;
			} else if (t->ttyp == TELEP_TRAP && m->has_defense != MUSE_TRAPDOOR) {
				trapx = xx;
				trapy = yy;
				m->has_defense = MUSE_TELEPORT_TRAP;
			}
		}
	}

	if (nohands(mtmp->data))	/* can't use objects */
		goto botm;

	if (is_mercenary(mtmp->data) && (obj = m_carrying(mtmp, BUGLE))) {
		int xx, yy;
		struct monst *mon;

		/* Distance is arbitrary.  What we really want to do is
		 * have the soldier play the bugle when it sees or
		 * remembers soldiers nearby...
		 */
		for (xx = x-3; xx <= x+3; xx++) for(yy = y-3; yy <= y+3; yy++)
		if (isok(xx,yy))
		if ((mon = m_at(lev, xx,yy)) && is_mercenary(mon->data) &&
				mon->data != &mons[PM_GUARD] &&
				(mon->msleeping || (!mon->mcanmove))) {
			m->defensive = obj;
			m->has_defense = MUSE_BUGLE;
		}
	}

	/* use immediate physical escape prior to attempting magic */
	if (m->has_defense)    /* stairs, trap door or tele-trap, bugle alert */
		goto botm;

	/* kludge to cut down on trap destruction (particularly portals) */
	t = t_at(lev, x,y);
	if (t && (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
		  t->ttyp == WEB || t->ttyp == BEAR_TRAP))
		t = 0;		/* ok for monster to dig here */

#define nomore(x) if (m->has_defense==x) continue;
	for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		/* don't always use the same selection pattern */
		if (m->has_defense && !rn2(3)) break;

		/* nomore(MUSE_WAN_DIGGING); */
		if (m->has_defense == MUSE_WAN_DIGGING) break;
		if (obj->otyp == WAN_DIGGING && obj->spe > 0 && !stuck && !t
		    && !mtmp->isshk && !mtmp->isgd && !mtmp->ispriest
		    && !is_floater(mtmp->data)
		    /* monsters digging in Sokoban can ruin things */
		    && !In_sokoban(&u.uz)
		    /* digging wouldn't be effective; assume they know that */
		    && !(lev->locations[x][y].wall_info & W_NONDIGGABLE)
		    && !(Is_botlevel(&u.uz) || In_endgame(&u.uz))
		    && !(is_ice(lev, x,y) || is_pool(lev, x,y) || is_lava(lev, x,y))
		    && !(mtmp->data == &mons[PM_VLAD_THE_IMPALER]
			 && In_V_tower(&u.uz))) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_DIGGING;
		}
		nomore(MUSE_WAN_TELEPORTATION_SELF);
		nomore(MUSE_WAN_TELEPORTATION);
		if (obj->otyp == WAN_TELEPORTATION && obj->spe > 0) {
		    /* use the TELEP_TRAP bit to determine if they know
		     * about noteleport on this level or not.  Avoids
		     * ineffective re-use of teleportation.  This does
		     * mean if the monster leaves the level, they'll know
		     * about teleport traps.
		     */
		    if (!lev->flags.noteleport ||
			!(mtmp->mtrapseen & (1 << (TELEP_TRAP-1)))) {
			m->defensive = obj;
			m->has_defense = (mon_has_amulet(mtmp))
				? MUSE_WAN_TELEPORTATION
				: MUSE_WAN_TELEPORTATION_SELF;
		    }
		}
		nomore(MUSE_SCR_TELEPORTATION);
		if (obj->otyp == SCR_TELEPORTATION && mtmp->mcansee
		   && haseyes(mtmp->data)
		   && (!obj->cursed ||
		       (!(mtmp->isshk && inhishop(mtmp))
			    && !mtmp->isgd && !mtmp->ispriest))) {
		    /* see WAN_TELEPORTATION case above */
		    if (!lev->flags.noteleport ||
			!(mtmp->mtrapseen & (1 << (TELEP_TRAP-1)))) {
			m->defensive = obj;
			m->has_defense = MUSE_SCR_TELEPORTATION;
		    }
		}

	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		nomore(MUSE_POT_FULL_HEALING);
		if (obj->otyp == POT_FULL_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_FULL_HEALING;
		}
		nomore(MUSE_POT_EXTRA_HEALING);
		if (obj->otyp == POT_EXTRA_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_EXTRA_HEALING;
		}
		nomore(MUSE_WAN_CREATE_MONSTER);
		if (obj->otyp == WAN_CREATE_MONSTER && obj->spe > 0) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_CREATE_MONSTER;
		}
		nomore(MUSE_POT_HEALING);
		if (obj->otyp == POT_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_HEALING;
		}
		nomore(MUSE_POT_VAMPIRE_BLOOD);
		if (is_vampire(mtmp->data) && obj->otyp == POT_VAMPIRE_BLOOD) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
		}
	    } else {	/* Pestilence */
		nomore(MUSE_POT_FULL_HEALING);
		if (obj->otyp == POT_SICKNESS) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_FULL_HEALING;
		}
		nomore(MUSE_WAN_CREATE_MONSTER);
		if (obj->otyp == WAN_CREATE_MONSTER && obj->spe > 0) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_CREATE_MONSTER;
		}
	    }
		nomore(MUSE_SCR_CREATE_MONSTER);
		if (obj->otyp == SCR_CREATE_MONSTER) {
			m->defensive = obj;
			m->has_defense = MUSE_SCR_CREATE_MONSTER;
		}
	}
botm:	return (boolean)(!!m->has_defense);
#undef nomore
}